

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O0

int BN_from_montgomery_word(BIGNUM *ret,BIGNUM *r,BN_MONT_CTX *mont)

{
  int num;
  ulong *bp;
  long lVar1;
  ulong *rp_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  BIGNUM *pBVar7;
  ulong uVar8;
  ulong *ap_00;
  long in_RDX;
  BIGNUM *in_RSI;
  BIGNUM *in_RDI;
  unsigned_long t4;
  unsigned_long t3;
  unsigned_long t2;
  unsigned_long t1;
  size_t m;
  unsigned_long *nrp;
  int i;
  int max;
  int nl;
  unsigned_long carry;
  unsigned_long v;
  unsigned_long n0;
  unsigned_long *rp;
  unsigned_long *np;
  unsigned_long *ap;
  BIGNUM *n;
  undefined8 in_stack_ffffffffffffff68;
  int words;
  BIGNUM *in_stack_ffffffffffffff70;
  int local_64;
  ulong local_58;
  ulong *local_40;
  int local_4;
  
  num = *(int *)(in_RDX + 0x28);
  if (num == 0) {
    in_RDI->top = 0;
    local_4 = 1;
  }
  else {
    words = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    pBVar7 = bn_wexpand(in_stack_ffffffffffffff70,words);
    if (pBVar7 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      in_RSI->neg = *(uint *)(in_RDX + 0x30) ^ in_RSI->neg;
      bp = *(ulong **)(in_RDX + 0x20);
      local_40 = in_RSI->d;
      iVar6 = num * 2 - in_RSI->top;
      if (iVar6 != 0) {
        memset(local_40 + in_RSI->top,0,(long)iVar6 << 3);
      }
      in_RSI->top = num * 2;
      lVar1 = *(long *)(in_RDX + 0x50);
      local_58 = 0;
      for (local_64 = 0; local_64 < num; local_64 = local_64 + 1) {
        uVar8 = bn_mul_add_words(local_40,bp,num,*local_40 * lVar1);
        uVar8 = uVar8 + local_58 + local_40[num];
        local_58 = (long)(int)(uint)(uVar8 <= local_40[num]) &
                   ((long)(int)(uint)(uVar8 != local_40[num]) | local_58);
        local_40[num] = uVar8;
        local_40 = local_40 + 1;
      }
      pBVar7 = bn_wexpand(in_stack_ffffffffffffff70,words);
      if (pBVar7 == (BIGNUM *)0x0) {
        local_4 = 0;
      }
      else {
        in_RDI->top = num;
        in_RDI->neg = in_RSI->neg;
        rp_00 = in_RDI->d;
        ap_00 = in_RSI->d + num;
        uVar8 = bn_sub_words(rp_00,ap_00,bp,num);
        uVar8 = (ulong)rp_00 & (-(uVar8 - local_58) ^ 0xffffffffffffffff) |
                (ulong)ap_00 & -(uVar8 - local_58);
        for (local_64 = 0; local_64 < num + -4; local_64 = local_64 + 4) {
          uVar2 = *(ulong *)(uVar8 + (long)local_64 * 8);
          uVar3 = *(ulong *)(uVar8 + (long)(local_64 + 1) * 8);
          uVar4 = *(ulong *)(uVar8 + (long)(local_64 + 2) * 8);
          ap_00[local_64] = 0;
          uVar5 = *(ulong *)(uVar8 + (long)(local_64 + 3) * 8);
          ap_00[local_64 + 1] = 0;
          rp_00[local_64] = uVar2;
          ap_00[local_64 + 2] = 0;
          rp_00[local_64 + 1] = uVar3;
          ap_00[local_64 + 3] = 0;
          rp_00[local_64 + 2] = uVar4;
          rp_00[local_64 + 3] = uVar5;
        }
        for (; local_64 < num; local_64 = local_64 + 1) {
          rp_00[local_64] = *(ulong *)(uVar8 + (long)local_64 * 8);
          ap_00[local_64] = 0;
        }
        bn_correct_top(in_RSI);
        bn_correct_top(in_RDI);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int BN_from_montgomery_word(BIGNUM *ret, BIGNUM *r, BN_MONT_CTX *mont)
{
    BIGNUM *n;
    BN_ULONG *ap, *np, *rp, n0, v, carry;
    int nl, max, i;

    n = &(mont->N);
    nl = n->top;
    if (nl == 0) {
        ret->top = 0;
        return (1);
    }

    max = (2 * nl);             /* carry is stored separately */
    if (bn_wexpand(r, max) == NULL)
        return (0);

    r->neg ^= n->neg;
    np = n->d;
    rp = r->d;

    /* clear the top words of T */
    i = max - r->top;
    if (i)
        memset(&rp[r->top], 0, sizeof(*rp) * i);

    r->top = max;
    n0 = mont->n0[0];

    for (carry = 0, i = 0; i < nl; i++, rp++) {
        v = bn_mul_add_words(rp, np, nl, (rp[0] * n0) & BN_MASK2);
        v = (v + carry + rp[nl]) & BN_MASK2;
        carry |= (v != rp[nl]);
        carry &= (v <= rp[nl]);
        rp[nl] = v;
    }

    if (bn_wexpand(ret, nl) == NULL)
        return (0);
    ret->top = nl;
    ret->neg = r->neg;

    rp = ret->d;
    ap = &(r->d[nl]);

# define BRANCH_FREE 1
# if BRANCH_FREE
    {
        BN_ULONG *nrp;
        size_t m;

        v = bn_sub_words(rp, ap, np, nl) - carry;
        /*
         * if subtraction result is real, then trick unconditional memcpy
         * below to perform in-place "refresh" instead of actual copy.
         */
        m = (0 - (size_t)v);
        nrp =
            (BN_ULONG *)(((PTR_SIZE_INT) rp & ~m) | ((PTR_SIZE_INT) ap & m));

        for (i = 0, nl -= 4; i < nl; i += 4) {
            BN_ULONG t1, t2, t3, t4;

            t1 = nrp[i + 0];
            t2 = nrp[i + 1];
            t3 = nrp[i + 2];
            ap[i + 0] = 0;
            t4 = nrp[i + 3];
            ap[i + 1] = 0;
            rp[i + 0] = t1;
            ap[i + 2] = 0;
            rp[i + 1] = t2;
            ap[i + 3] = 0;
            rp[i + 2] = t3;
            rp[i + 3] = t4;
        }
        for (nl += 4; i < nl; i++)
            rp[i] = nrp[i], ap[i] = 0;
    }
# else
    if (bn_sub_words(rp, ap, np, nl) - carry)
        memcpy(rp, ap, nl * sizeof(BN_ULONG));
# endif
    bn_correct_top(r);
    bn_correct_top(ret);
    bn_check_top(ret);

    return (1);
}